

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

SpotLight *
pbrt::SpotLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SpotLight *pSVar3;
  Transform *__return_storage_ptr__;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  Float FVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar11;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar12;
  Point3f delta;
  Point3f PVar13;
  Vector3<float> z;
  Float sc;
  allocator<char> local_27d;
  Float local_27c;
  float local_278;
  Float coneangle;
  SpectrumHandle I;
  Allocator alloc_local;
  Transform dirToZ;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_1b8;
  ulong local_1b0;
  Transform t;
  Transform local_128;
  Transform finalRenderFromLight;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&dirToZ,"I",(allocator<char> *)&t);
  local_1b0 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&I,(string *)parameters,(SpectrumHandle *)&dirToZ,
             (SpectrumType)&local_1b0,(Allocator)0x2);
  std::__cxx11::string::~string((string *)&dirToZ);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirToZ,"scale",(allocator<char> *)&t);
  FVar4 = ParameterDictionary::GetOneFloat(parameters,(string *)&dirToZ,1.0);
  std::__cxx11::string::~string((string *)&dirToZ);
  sc = FVar4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirToZ,"coneangle",(allocator<char> *)&t);
  FVar5 = ParameterDictionary::GetOneFloat(parameters,(string *)&dirToZ,30.0);
  std::__cxx11::string::~string((string *)&dirToZ);
  coneangle = FVar5;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirToZ,"conedeltaangle",(allocator<char> *)&t);
  local_27c = ParameterDictionary::GetOneFloat(parameters,(string *)&dirToZ,5.0);
  std::__cxx11::string::~string((string *)&dirToZ);
  uVar11 = extraout_XMM0_Qb;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirToZ,"from",(allocator<char> *)&finalRenderFromLight);
  t.m.m[0][0] = 0.0;
  t.m.m[0][1] = 0.0;
  t.m.m[0][2] = 0.0;
  delta = ParameterDictionary::GetOnePoint3f(parameters,(string *)&dirToZ,(Point3f *)&t);
  std::__cxx11::string::~string((string *)&dirToZ);
  uVar12 = extraout_XMM0_Qb_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dirToZ,"to",(allocator<char> *)&finalRenderFromLight);
  t.m.m[0][0] = 0.0;
  t.m.m[0][1] = 0.0;
  t.m.m[0][2] = 1.0;
  PVar13 = ParameterDictionary::GetOnePoint3f(parameters,(string *)&dirToZ,(Point3f *)&t);
  local_278 = PVar13.super_Tuple3<pbrt::Point3,_float>.z;
  std::__cxx11::string::~string((string *)&dirToZ);
  auVar2._8_8_ = uVar12;
  auVar2._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1._8_8_ = uVar11;
  auVar1._0_8_ = delta.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar1 = vsubps_avx(auVar2,auVar1);
  finalRenderFromLight.m.m[0][2] = local_278 - delta.super_Tuple3<pbrt::Point3,_float>.z;
  finalRenderFromLight.m.m[0]._0_8_ = vmovlps_avx(auVar1);
  z = Normalize<float>((Vector3<float> *)&finalRenderFromLight);
  __return_storage_ptr__ = &t;
  Frame::FromZ((Frame *)__return_storage_ptr__,(Vector3f)z.super_Tuple3<pbrt::Vector3,_float>);
  Transform::Transform(&dirToZ,(Frame *)__return_storage_ptr__);
  Translate(&finalRenderFromLight,(pbrt *)__return_storage_ptr__,
            (Vector3f)delta.super_Tuple3<pbrt::Point3,_float>);
  local_128.m.m[0][0] = dirToZ.mInv.m[0][0];
  local_128.m.m[0][1] = dirToZ.mInv.m[0][1];
  local_128.m.m[0][2] = dirToZ.mInv.m[0][2];
  local_128.m.m[0][3] = dirToZ.mInv.m[0][3];
  local_128.m.m[1][0] = dirToZ.mInv.m[1][0];
  local_128.m.m[1][1] = dirToZ.mInv.m[1][1];
  local_128.m.m[1][2] = dirToZ.mInv.m[1][2];
  local_128.m.m[1][3] = dirToZ.mInv.m[1][3];
  local_128.m.m[2][0] = dirToZ.mInv.m[2][0];
  local_128.m.m[2][1] = dirToZ.mInv.m[2][1];
  local_128.m.m[2][2] = dirToZ.mInv.m[2][2];
  local_128.m.m[2][3] = dirToZ.mInv.m[2][3];
  local_128.m.m[3][0] = dirToZ.mInv.m[3][0];
  local_128.m.m[3][1] = dirToZ.mInv.m[3][1];
  local_128.m.m[3][2] = dirToZ.mInv.m[3][2];
  local_128.m.m[3][3] = dirToZ.mInv.m[3][3];
  local_128.mInv.m[0][0] = dirToZ.m.m[0][0];
  local_128.mInv.m[0][1] = dirToZ.m.m[0][1];
  local_128.mInv.m[0][2] = dirToZ.m.m[0][2];
  local_128.mInv.m[0][3] = dirToZ.m.m[0][3];
  local_128.mInv.m[1][0] = dirToZ.m.m[1][0];
  local_128.mInv.m[1][1] = dirToZ.m.m[1][1];
  local_128.mInv.m[1][2] = dirToZ.m.m[1][2];
  local_128.mInv.m[1][3] = dirToZ.m.m[1][3];
  local_128.mInv.m[2][0] = dirToZ.m.m[2][0];
  local_128.mInv.m[2][1] = dirToZ.m.m[2][1];
  local_128.mInv.m[2][2] = dirToZ.m.m[2][2];
  local_128.mInv.m[2][3] = dirToZ.m.m[2][3];
  local_128.mInv.m[3][0] = dirToZ.m.m[3][0];
  local_128.mInv.m[3][1] = dirToZ.m.m[3][1];
  local_128.mInv.m[3][2] = dirToZ.m.m[3][2];
  local_128.mInv.m[3][3] = dirToZ.m.m[3][3];
  Transform::operator*(&t,&finalRenderFromLight,&local_128);
  Transform::operator*(&finalRenderFromLight,renderFromLight,&t);
  local_1b8 = I.
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
              .bits;
  FVar6 = SpectrumToPhotometric((SpectrumHandle *)&local_1b8);
  sc = FVar4 / FVar6;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"power",&local_27d);
  FVar7 = ParameterDictionary::GetOneFloat(parameters,(string *)&local_128,-1.0);
  std::__cxx11::string::~string((string *)&local_128);
  if (FVar7 <= 0.0) {
    fVar10 = FVar5 - local_27c;
  }
  else {
    fVar8 = cosf(FVar5 * 0.017453292);
    fVar10 = FVar5 - local_27c;
    fVar9 = cosf(fVar10 * 0.017453292);
    sc = (FVar7 / (((1.0 - fVar9) + (fVar9 - fVar8) * 0.5) * 6.2831855)) * (FVar4 / FVar6);
  }
  local_128.m.m[0][0] = fVar10;
  pSVar3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpotLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,float&,float,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&alloc_local,&finalRenderFromLight,medium,&I,&sc,&coneangle,
                      (float *)&local_128,&alloc_local);
  return pSVar3;
}

Assistant:

SpotLight *SpotLight::Create(const Transform &renderFromLight, MediumHandle medium,
                             const ParameterDictionary &parameters,
                             const RGBColorSpace *colorSpace, const FileLoc *loc,
                             Allocator alloc) {
    SpectrumHandle I = parameters.GetOneSpectrum("I", &colorSpace->illuminant,
                                                 SpectrumType::Illuminant, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Float coneangle = parameters.GetOneFloat("coneangle", 30.);
    Float conedelta = parameters.GetOneFloat("conedeltaangle", 5.);
    // Compute spotlight world to light transformation
    Point3f from = parameters.GetOnePoint3f("from", Point3f(0, 0, 0));
    Point3f to = parameters.GetOnePoint3f("to", Point3f(0, 0, 1));

    Transform dirToZ = (Transform)Frame::FromZ(Normalize(to - from));
    Transform t = Translate(Vector3f(from.x, from.y, from.z)) * Inverse(dirToZ);
    Transform finalRenderFromLight = renderFromLight * t;

    sc /= SpectrumToPhotometric(I);

    Float phi_v = parameters.GetOneFloat("power", -1);
    if (phi_v > 0) {
        Float cosFalloffEnd = std::cos(Radians(coneangle));
        Float cosFalloffStart = std::cos(Radians(coneangle - conedelta));
        Float k_e =
            2 * Pi * ((1 - cosFalloffStart) + (cosFalloffStart - cosFalloffEnd) / 2);
        sc *= phi_v / k_e;
    }

    return alloc.new_object<SpotLight>(finalRenderFromLight, medium, I, sc, coneangle,
                                       coneangle - conedelta, alloc);
}